

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void attachFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  uint uVar1;
  sqlite3 *db_00;
  sqlite3_vfs *psVar2;
  Schema *pSVar3;
  char *pcVar4;
  sqlite3_context *in_RDI;
  long in_FS_OFFSET;
  sqlite3_vfs *unaff_retaddr;
  uint *in_stack_00000008;
  char *in_stack_00000010;
  int iDb;
  Pager *pPager;
  Schema *pNewSchema;
  Db *pNew;
  Db *aNew;
  char *zFile;
  char *zName;
  sqlite3 *db;
  int rc;
  int i;
  Btree *pNewBt;
  sqlite3_vfs *pVfs;
  char *zErrDyn;
  uint flags;
  char *zErr;
  char *zPath;
  undefined4 in_stack_ffffffffffffff58;
  uint in_stack_ffffffffffffff5c;
  sqlite3 *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  sqlite3 *in_stack_ffffffffffffff70;
  Db *local_80;
  Db *local_78;
  uchar *local_70;
  uchar *local_68;
  int local_58;
  int local_54;
  char *local_28;
  int in_stack_ffffffffffffffe0;
  int iVar5;
  Btree **ppBtree;
  sqlite3 *db_01;
  char **pzFile;
  
  pzFile = *(char ***)(in_FS_OFFSET + 0x28);
  local_58 = 0;
  db_00 = sqlite3_context_db_handle(in_RDI);
  db_01 = (sqlite3 *)0x0;
  ppBtree = (Btree **)0x0;
  iVar5 = -0x55555556;
  local_80 = (Db *)0x0;
  local_28 = (char *)0x0;
  local_70 = sqlite3_value_text((sqlite3_value *)0x21f4fa);
  local_68 = sqlite3_value_text((sqlite3_value *)0x21f50d);
  if (local_70 == (uchar *)0x0) {
    local_70 = "";
  }
  if (local_68 == (uchar *)0x0) {
    local_68 = "";
  }
  if (((byte)(db_00->init).field_0x6 >> 2 & 1) == 0) {
    if (db_00->nDb < db_00->aLimit[7] + 2) {
      for (local_54 = 0; local_54 < db_00->nDb; local_54 = local_54 + 1) {
        iVar5 = sqlite3DbIsNamed(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                                 (char *)in_stack_ffffffffffffff60);
        if (iVar5 != 0) {
          local_28 = sqlite3MPrintf(db_00,"database %s is already in use",local_68);
          goto LAB_0021fc54;
        }
      }
      if (db_00->aDb == db_00->aDbStatic) {
        local_78 = (Db *)sqlite3DbMallocRawNN
                                   ((sqlite3 *)
                                    CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                                    (u64)in_stack_ffffffffffffff60);
        if (local_78 == (Db *)0x0) goto LAB_0021fc9d;
        memcpy(local_78,db_00->aDb,0x40);
      }
      else {
        local_78 = (Db *)sqlite3DbRealloc((sqlite3 *)
                                          CONCAT44(in_stack_ffffffffffffff6c,
                                                   in_stack_ffffffffffffff68),
                                          in_stack_ffffffffffffff60,
                                          CONCAT44(in_stack_ffffffffffffff5c,
                                                   in_stack_ffffffffffffff58));
        if (local_78 == (Db *)0x0) goto LAB_0021fc9d;
      }
      db_00->aDb = local_78;
      local_80 = db_00->aDb + db_00->nDb;
      memset(local_80,0,0x20);
      uVar1 = db_00->openFlags;
      iVar5 = sqlite3ParseUri((char *)pPager,in_stack_00000010,in_stack_00000008,
                              (sqlite3_vfs **)unaff_retaddr,pzFile,(char **)db_01);
      if (iVar5 != 0) {
        if (iVar5 == 7) {
          sqlite3OomFault(in_stack_ffffffffffffff60);
        }
        sqlite3_result_error
                  ((sqlite3_context *)in_stack_ffffffffffffff60,
                   (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),0);
        sqlite3_free((void *)0x21f83e);
        goto LAB_0021fc9d;
      }
      if ((db_00->flags & 0x2000000000) == 0) {
        uVar1 = uVar1 & 0xfffffff9 | 1;
      }
      else if ((db_00->flags & 0x1000000000) == 0) {
        uVar1 = uVar1 & 0xfffffffb;
      }
      local_58 = sqlite3BtreeOpen(unaff_retaddr,(char *)pzFile,db_01,ppBtree,uVar1 | 0x100,
                                  in_stack_ffffffffffffffe0);
      db_00->nDb = db_00->nDb + 1;
      pcVar4 = sqlite3DbStrDup((sqlite3 *)
                               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                               (char *)in_stack_ffffffffffffff60);
      local_80->zDbSName = pcVar4;
LAB_0021f916:
      db_00->noSharedCache = '\0';
      if (local_58 == 0x13) {
        local_58 = 1;
        local_28 = sqlite3MPrintf(db_00,"database is already attached");
      }
      else if (local_58 == 0) {
        pSVar3 = sqlite3SchemaGet(in_stack_ffffffffffffff60,
                                  (Btree *)CONCAT44(in_stack_ffffffffffffff5c,
                                                    in_stack_ffffffffffffff58));
        local_80->pSchema = pSVar3;
        if (local_80->pSchema == (Schema *)0x0) {
          local_58 = 7;
        }
        else if ((local_80->pSchema->file_format != '\0') && (local_80->pSchema->enc != db_00->enc))
        {
          local_28 = sqlite3MPrintf(db_00,
                                    "attached databases must use the same text encoding as main database"
                                   );
          local_58 = 1;
        }
        sqlite3BtreeEnter((Btree *)0x21f9fc);
        sqlite3BtreePager(local_80->pBt);
        sqlite3PagerLockingMode((Pager *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
        in_stack_ffffffffffffff60 = (sqlite3 *)local_80->pBt;
        sqlite3BtreeSecureDelete
                  ((Btree *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),0);
        sqlite3BtreeSecureDelete
                  ((Btree *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),0);
        sqlite3BtreeSetPagerFlags((Btree *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
        sqlite3BtreeLeave((Btree *)0x21fa82);
      }
      local_80->safety_level = '\x03';
      if ((local_58 == 0) && (local_80->zDbSName == (char *)0x0)) {
        local_58 = 7;
      }
      sqlite3_free_filename((char *)0x21fab4);
      if (local_58 == 0) {
        sqlite3BtreeEnterAll((sqlite3 *)0x21fac5);
        (db_00->init).iDb = '\0';
        db_00->mDbFlags = db_00->mDbFlags & 0xffffffef;
        if (((byte)(db_00->init).field_0x6 >> 2 & 1) == 0) {
          local_58 = sqlite3Init((sqlite3 *)
                                 CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                                 (char **)in_stack_ffffffffffffff60);
        }
        sqlite3BtreeLeaveAll((sqlite3 *)0x21fb17);
      }
      if (local_58 == 0) goto LAB_0021fc9d;
      if (((byte)(db_00->init).field_0x6 >> 2 & 1) == 0) {
        iVar5 = db_00->nDb + -1;
        if (db_00->aDb[iVar5].pBt != (Btree *)0x0) {
          sqlite3BtreeClose((Btree *)in_stack_ffffffffffffff60);
          db_00->aDb[iVar5].pBt = (Btree *)0x0;
          db_00->aDb[iVar5].pSchema = (Schema *)0x0;
        }
        sqlite3ResetAllSchemasOfConnection(in_stack_ffffffffffffff60);
        db_00->nDb = iVar5;
        if ((local_58 == 7) || (local_58 == 0xc0a)) {
          sqlite3OomFault(in_stack_ffffffffffffff60);
          sqlite3DbFree(in_stack_ffffffffffffff60,
                        (void *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
          local_28 = sqlite3MPrintf(db_00,"out of memory");
        }
        else if (local_28 == (char *)0x0) {
          local_28 = sqlite3MPrintf(db_00,"unable to open database: %s",local_70);
        }
      }
    }
    else {
      local_28 = sqlite3MPrintf(db_00,"too many attached databases - max %d",
                                (ulong)(uint)db_00->aLimit[7]);
    }
  }
  else {
    psVar2 = sqlite3_vfs_find((char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68))
    ;
    if (psVar2 == (sqlite3_vfs *)0x0) goto LAB_0021fc9d;
    local_58 = sqlite3BtreeOpen(unaff_retaddr,(char *)pzFile,db_01,ppBtree,iVar5,
                                in_stack_ffffffffffffffe0);
    if (local_58 == 0) {
      pSVar3 = sqlite3SchemaGet(in_stack_ffffffffffffff60,
                                (Btree *)CONCAT44(in_stack_ffffffffffffff5c,
                                                  in_stack_ffffffffffffff58));
      if (pSVar3 == (Schema *)0x0) {
        sqlite3BtreeClose((Btree *)in_stack_ffffffffffffff60);
        local_58 = 7;
      }
      else {
        local_80 = db_00->aDb + (db_00->init).iDb;
        if (local_80->pBt != (Btree *)0x0) {
          sqlite3BtreeClose((Btree *)in_stack_ffffffffffffff60);
        }
        local_80->pBt = (Btree *)0x0;
        local_80->pSchema = pSVar3;
      }
    }
    if (local_58 == 0) goto LAB_0021f916;
  }
LAB_0021fc54:
  if (local_28 != (char *)0x0) {
    sqlite3_result_error
              ((sqlite3_context *)in_stack_ffffffffffffff60,
               (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),0);
    sqlite3DbFree(in_stack_ffffffffffffff60,
                  (void *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  }
  if (local_58 != 0) {
    sqlite3_result_error_code
              ((sqlite3_context *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  }
LAB_0021fc9d:
  if (*(char ***)(in_FS_OFFSET + 0x28) != pzFile) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void attachFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  int i;
  int rc = 0;
  sqlite3 *db = sqlite3_context_db_handle(context);
  const char *zName;
  const char *zFile;
  char *zPath = 0;
  char *zErr = 0;
  unsigned int flags;
  Db *aNew;                 /* New array of Db pointers */
  Db *pNew = 0;             /* Db object for the newly attached database */
  char *zErrDyn = 0;
  sqlite3_vfs *pVfs;

  UNUSED_PARAMETER(NotUsed);
  zFile = (const char *)sqlite3_value_text(argv[0]);
  zName = (const char *)sqlite3_value_text(argv[1]);
  if( zFile==0 ) zFile = "";
  if( zName==0 ) zName = "";

#ifndef SQLITE_OMIT_DESERIALIZE
# define REOPEN_AS_MEMDB(db)  (db->init.reopenMemdb)
#else
# define REOPEN_AS_MEMDB(db)  (0)
#endif

  if( REOPEN_AS_MEMDB(db) ){
    /* This is not a real ATTACH.  Instead, this routine is being called
    ** from sqlite3_deserialize() to close database db->init.iDb and
    ** reopen it as a MemDB */
    Btree *pNewBt = 0;
    pVfs = sqlite3_vfs_find("memdb");
    if( pVfs==0 ) return;
    rc = sqlite3BtreeOpen(pVfs, "x\0", db, &pNewBt, 0, SQLITE_OPEN_MAIN_DB);
    if( rc==SQLITE_OK ){
      Schema *pNewSchema = sqlite3SchemaGet(db, pNewBt);
      if( pNewSchema ){
        /* Both the Btree and the new Schema were allocated successfully.
        ** Close the old db and update the aDb[] slot with the new memdb
        ** values.  */
        pNew = &db->aDb[db->init.iDb];
        if( ALWAYS(pNew->pBt) ) sqlite3BtreeClose(pNew->pBt);
        pNew->pBt = pNewBt;
        pNew->pSchema = pNewSchema;
      }else{
        sqlite3BtreeClose(pNewBt);
        rc = SQLITE_NOMEM;
      }
    }
    if( rc ) goto attach_error;
  }else{
    /* This is a real ATTACH
    **
    ** Check for the following errors:
    **
    **     * Too many attached databases,
    **     * Transaction currently open
    **     * Specified database name already being used.
    */
    if( db->nDb>=db->aLimit[SQLITE_LIMIT_ATTACHED]+2 ){
      zErrDyn = sqlite3MPrintf(db, "too many attached databases - max %d",
        db->aLimit[SQLITE_LIMIT_ATTACHED]
      );
      goto attach_error;
    }
    for(i=0; i<db->nDb; i++){
      assert( zName );
      if( sqlite3DbIsNamed(db, i, zName) ){
        zErrDyn = sqlite3MPrintf(db, "database %s is already in use", zName);
        goto attach_error;
      }
    }

    /* Allocate the new entry in the db->aDb[] array and initialize the schema
    ** hash tables.
    */
    if( db->aDb==db->aDbStatic ){
      aNew = sqlite3DbMallocRawNN(db, sizeof(db->aDb[0])*3 );
      if( aNew==0 ) return;
      memcpy(aNew, db->aDb, sizeof(db->aDb[0])*2);
    }else{
      aNew = sqlite3DbRealloc(db, db->aDb, sizeof(db->aDb[0])*(db->nDb+1) );
      if( aNew==0 ) return;
    }
    db->aDb = aNew;
    pNew = &db->aDb[db->nDb];
    memset(pNew, 0, sizeof(*pNew));

    /* Open the database file. If the btree is successfully opened, use
    ** it to obtain the database schema. At this point the schema may
    ** or may not be initialized.
    */
    flags = db->openFlags;
    rc = sqlite3ParseUri(db->pVfs->zName, zFile, &flags, &pVfs, &zPath, &zErr);
    if( rc!=SQLITE_OK ){
      if( rc==SQLITE_NOMEM ) sqlite3OomFault(db);
      sqlite3_result_error(context, zErr, -1);
      sqlite3_free(zErr);
      return;
    }
    if( (db->flags & SQLITE_AttachWrite)==0 ){
      flags &= ~(SQLITE_OPEN_CREATE|SQLITE_OPEN_READWRITE);
      flags |= SQLITE_OPEN_READONLY;
    }else if( (db->flags & SQLITE_AttachCreate)==0 ){
      flags &= ~SQLITE_OPEN_CREATE;
    }
    assert( pVfs );
    flags |= SQLITE_OPEN_MAIN_DB;
    rc = sqlite3BtreeOpen(pVfs, zPath, db, &pNew->pBt, 0, flags);
    db->nDb++;
    pNew->zDbSName = sqlite3DbStrDup(db, zName);
  }
  db->noSharedCache = 0;
  if( rc==SQLITE_CONSTRAINT ){
    rc = SQLITE_ERROR;
    zErrDyn = sqlite3MPrintf(db, "database is already attached");
  }else if( rc==SQLITE_OK ){
    Pager *pPager;
    pNew->pSchema = sqlite3SchemaGet(db, pNew->pBt);
    if( !pNew->pSchema ){
      rc = SQLITE_NOMEM_BKPT;
    }else if( pNew->pSchema->file_format && pNew->pSchema->enc!=ENC(db) ){
      zErrDyn = sqlite3MPrintf(db,
        "attached databases must use the same text encoding as main database");
      rc = SQLITE_ERROR;
    }
    sqlite3BtreeEnter(pNew->pBt);
    pPager = sqlite3BtreePager(pNew->pBt);
    sqlite3PagerLockingMode(pPager, db->dfltLockMode);
    sqlite3BtreeSecureDelete(pNew->pBt,
                             sqlite3BtreeSecureDelete(db->aDb[0].pBt,-1) );
#ifndef SQLITE_OMIT_PAGER_PRAGMAS
    sqlite3BtreeSetPagerFlags(pNew->pBt,
                      PAGER_SYNCHRONOUS_FULL | (db->flags & PAGER_FLAGS_MASK));
#endif
    sqlite3BtreeLeave(pNew->pBt);
  }
  pNew->safety_level = SQLITE_DEFAULT_SYNCHRONOUS+1;
  if( rc==SQLITE_OK && pNew->zDbSName==0 ){
    rc = SQLITE_NOMEM_BKPT;
  }
  sqlite3_free_filename( zPath );

  /* If the file was opened successfully, read the schema for the new database.
  ** If this fails, or if opening the file failed, then close the file and
  ** remove the entry from the db->aDb[] array. i.e. put everything back the
  ** way we found it.
  */
  if( rc==SQLITE_OK ){
    sqlite3BtreeEnterAll(db);
    db->init.iDb = 0;
    db->mDbFlags &= ~(DBFLAG_SchemaKnownOk);
    if( !REOPEN_AS_MEMDB(db) ){
      rc = sqlite3Init(db, &zErrDyn);
    }
    sqlite3BtreeLeaveAll(db);
    assert( zErrDyn==0 || rc!=SQLITE_OK );
  }
  if( rc ){
    if( ALWAYS(!REOPEN_AS_MEMDB(db)) ){
      int iDb = db->nDb - 1;
      assert( iDb>=2 );
      if( db->aDb[iDb].pBt ){
        sqlite3BtreeClose(db->aDb[iDb].pBt);
        db->aDb[iDb].pBt = 0;
        db->aDb[iDb].pSchema = 0;
      }
      sqlite3ResetAllSchemasOfConnection(db);
      db->nDb = iDb;
      if( rc==SQLITE_NOMEM || rc==SQLITE_IOERR_NOMEM ){
        sqlite3OomFault(db);
        sqlite3DbFree(db, zErrDyn);
        zErrDyn = sqlite3MPrintf(db, "out of memory");
      }else if( zErrDyn==0 ){
        zErrDyn = sqlite3MPrintf(db, "unable to open database: %s", zFile);
      }
    }
    goto attach_error;
  }

  return;

attach_error:
  /* Return an error if we get here */
  if( zErrDyn ){
    sqlite3_result_error(context, zErrDyn, -1);
    sqlite3DbFree(db, zErrDyn);
  }
  if( rc ) sqlite3_result_error_code(context, rc);
}